

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockTests.cpp
# Opt level: O3

void __thiscall
vkt::ubo::anon_unknown_0::LinkByBindingCase::LinkByBindingCase
          (LinkByBindingCase *this,TestContext *testCtx,string *name,string *description,
          BufferMode bufferMode,int numInstances)

{
  ShaderInterface *this_00;
  vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_> *pvVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  UniformBlock *pUVar5;
  UniformBlock *pUVar6;
  string local_b8;
  VarType local_98;
  Uniform local_80;
  int local_3c;
  LinkByBindingCase *local_38;
  
  UniformBlockCase::UniformBlockCase
            (&this->super_UniformBlockCase,testCtx,name,description,bufferMode,LOAD_FULL_MATRIX,
             false);
  (this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformBlockCase_00d2f970;
  paVar2 = &local_80.m_name.field_2;
  local_80.m_name._M_dataplus._M_p = (pointer)paVar2;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"TestBlock","");
  this_00 = &(this->super_UniformBlockCase).m_interface;
  pUVar5 = ShaderInterface::allocBlock(this_00,&local_80.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.m_name._M_dataplus._M_p,
                    local_80.m_name.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"a","");
  VarType::VarType(&local_98,TYPE_FLOAT,4);
  local_3c = numInstances;
  Uniform::Uniform(&local_80,&local_b8,&local_98,0);
  pvVar1 = &pUVar5->m_uniforms;
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_80);
  VarType::~VarType(&local_80.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.m_name._M_dataplus._M_p,
                    local_80.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"b","");
  VarType::VarType(&local_98,TYPE_UINT_VEC3,1);
  Uniform::Uniform(&local_80,&local_b8,&local_98,0x1800);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_80);
  VarType::~VarType(&local_80.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.m_name._M_dataplus._M_p,
                    local_80.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"c","");
  VarType::VarType(&local_98,TYPE_FLOAT_MAT2,2);
  Uniform::Uniform(&local_80,&local_b8,&local_98,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_80);
  VarType::~VarType(&local_80.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.m_name._M_dataplus._M_p,
                    local_80.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  pUVar5->m_flags = 0x220;
  local_80.m_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"TestBlock","");
  pUVar6 = ShaderInterface::allocBlock(this_00,&local_80.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.m_name._M_dataplus._M_p,
                    local_80.m_name.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"a","");
  VarType::VarType(&local_98,TYPE_FLOAT_MAT3,2);
  Uniform::Uniform(&local_80,&local_b8,&local_98,0);
  pvVar1 = &pUVar6->m_uniforms;
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_80);
  VarType::~VarType(&local_80.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.m_name._M_dataplus._M_p,
                    local_80.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"b","");
  VarType::VarType(&local_98,TYPE_INT_VEC2,1);
  Uniform::Uniform(&local_80,&local_b8,&local_98,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_80);
  VarType::~VarType(&local_80.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.m_name._M_dataplus._M_p,
                    local_80.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"c","");
  VarType::VarType(&local_98,TYPE_FLOAT_VEC4,4);
  Uniform::Uniform(&local_80,&local_b8,&local_98,0x1800);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_80);
  VarType::~VarType(&local_80.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.m_name._M_dataplus._M_p,
                    local_80.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"d","");
  VarType::VarType(&local_98,TYPE_BOOL,0);
  Uniform::Uniform(&local_80,&local_b8,&local_98,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar1,&local_80);
  VarType::~VarType(&local_80.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.m_name._M_dataplus._M_p,
                    local_80.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_98);
  iVar4 = local_3c;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  pUVar6->m_flags = 0x420;
  if (0 < iVar4) {
    local_80.m_name._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"testBlock","");
    std::__cxx11::string::_M_assign((string *)&pUVar5->m_instanceName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.m_name._M_dataplus._M_p != paVar2) {
      operator_delete(local_80.m_name._M_dataplus._M_p,
                      local_80.m_name.field_2._M_allocated_capacity + 1);
    }
    pUVar5->m_arraySize = iVar4;
    local_80.m_name._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"testBlock","");
    std::__cxx11::string::_M_assign((string *)&pUVar6->m_instanceName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.m_name._M_dataplus._M_p != paVar2) {
      operator_delete(local_80.m_name._M_dataplus._M_p,
                      local_80.m_name.field_2._M_allocated_capacity + 1);
    }
    pUVar6->m_arraySize = iVar4;
  }
  (*(local_38->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [2])();
  return;
}

Assistant:

LinkByBindingCase (tcu::TestContext& testCtx, const std::string& name, const std::string& description, BufferMode bufferMode, int numInstances)
		: UniformBlockCase	(testCtx, name, description, bufferMode, LOAD_FULL_MATRIX)
	{
		UniformBlock& blockA = m_interface.allocBlock("TestBlock");
		blockA.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT, PRECISION_HIGH)));
		blockA.addUniform(Uniform("b", VarType(glu::TYPE_UINT_VEC3, PRECISION_LOW), UNUSED_BOTH));
		blockA.addUniform(Uniform("c", VarType(glu::TYPE_FLOAT_MAT2, PRECISION_MEDIUM)));
		blockA.setFlags(LAYOUT_STD140|DECLARE_VERTEX);

		UniformBlock& blockB = m_interface.allocBlock("TestBlock");
		blockB.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM)));
		blockB.addUniform(Uniform("b", VarType(glu::TYPE_INT_VEC2, PRECISION_LOW)));
		blockB.addUniform(Uniform("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH), UNUSED_BOTH));
		blockB.addUniform(Uniform("d", VarType(glu::TYPE_BOOL, 0)));
		blockB.setFlags(LAYOUT_STD140|DECLARE_FRAGMENT);

		if (numInstances > 0)
		{
			blockA.setInstanceName("testBlock");
			blockA.setArraySize(numInstances);
			blockB.setInstanceName("testBlock");
			blockB.setArraySize(numInstances);
		}

		init();
	}